

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS JlParseJsonEx(char *JsonString,_Bool IsJson5,JlDataObject **pRootObject,
                       size_t *pErrorAtPos)

{
  ParseStack *pPVar1;
  int local_74;
  int32_t i;
  ParseStack *stackItem;
  ParseParameters params;
  size_t prevStringIndex;
  JL_STATUS jlStatus;
  size_t *pErrorAtPos_local;
  JlDataObject **pRootObject_local;
  _Bool IsJson5_local;
  char *JsonString_local;
  
  if ((JsonString == (char *)0x0) || (pRootObject == (JlDataObject **)0x0)) {
    prevStringIndex._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    params.IsJson5 = false;
    params._41_7_ = 0;
    memset(&stackItem,0,0x30);
    params._8_8_ = JsonString;
    params.JsonString = (char *)strlen(JsonString);
    params.JsonStringLength = 0;
    params.StringIndex._0_1_ = IsJson5;
    stackItem = (ParseStack *)WjTestLib_Calloc(0xa50,1);
    if (pErrorAtPos != (size_t *)0x0) {
      *pErrorAtPos = 0;
    }
    if (stackItem == (ParseStack *)0x0) {
      prevStringIndex._4_4_ = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      params.Stack._0_4_ = 0;
      stackItem->Type = JL_DATA_TYPE_NONE;
      stackItem->ScanForSubObjects = true;
      prevStringIndex._4_4_ = JL_STATUS_SUCCESS;
      while (-1 < (int)params.Stack && prevStringIndex._4_4_ == JL_STATUS_SUCCESS) {
        pPVar1 = stackItem + (int)params.Stack;
        if ((pPVar1->FinishedProcessing & 1U) == 0) {
          params._40_8_ = params.JsonStringLength;
          if ((stackItem[(int)params.Stack].ScanForSubObjects & 1U) == 0) {
            if (pPVar1->Type == JL_DATA_TYPE_STRING) {
              prevStringIndex._4_4_ = ParseForString((ParseParameters *)&stackItem,pErrorAtPos);
            }
            else if (pPVar1->Type == JL_DATA_TYPE_NUMBER) {
              prevStringIndex._4_4_ = ParseForNumber((ParseParameters *)&stackItem);
            }
            else if (pPVar1->Type == JL_DATA_TYPE_BOOL) {
              prevStringIndex._4_4_ = ParseForBool((ParseParameters *)&stackItem);
            }
            else if (pPVar1->Type == JL_DATA_TYPE_LIST) {
              prevStringIndex._4_4_ = ParseForList((ParseParameters *)&stackItem,pErrorAtPos);
            }
            else if (pPVar1->Type == JL_DATA_TYPE_DICTIONARY) {
              prevStringIndex._4_4_ = ParseForDictionary((ParseParameters *)&stackItem,pErrorAtPos);
            }
          }
          else {
            if (stackItem[(int)params.Stack].Type == JL_DATA_TYPE_NONE) {
              pPVar1->FinishedProcessing = true;
              pPVar1->ScanForSubObjects = false;
            }
            pPVar1->ScanForSubObjects = false;
            prevStringIndex._4_4_ =
                 ParseForNewType((ParseParameters *)&stackItem,IsJson5,pErrorAtPos);
          }
        }
        else {
          prevStringIndex._4_4_ =
               AttachStackObjectToPreviousObject(stackItem,(int)params.Stack,pErrorAtPos);
          params.Stack._0_4_ = (int)params.Stack + -1;
        }
      }
      if (((prevStringIndex._4_4_ == JL_STATUS_SUCCESS) &&
          (prevStringIndex._4_4_ =
                VerifyOnlyTrailingWhiteSpace(JsonString + params.JsonStringLength,IsJson5),
          prevStringIndex._4_4_ != JL_STATUS_SUCCESS)) &&
         (params.Stack._0_4_ = 1, pErrorAtPos != (size_t *)0x0)) {
        *pErrorAtPos = params.JsonStringLength;
      }
      if (prevStringIndex._4_4_ == JL_STATUS_SUCCESS) {
        *pRootObject = stackItem[1].Object;
      }
      else {
        for (local_74 = (int)params.Stack; 0 < local_74; local_74 = local_74 + -1) {
          JlFreeObjectTree(&stackItem[local_74].Object);
          if (stackItem[local_74].CurrentKeyName != (char *)0x0) {
            WjTestLib_Free(stackItem[local_74].CurrentKeyName);
            stackItem[local_74].CurrentKeyName = (char *)0x0;
          }
        }
      }
      WjTestLib_Free(stackItem);
    }
    if (((prevStringIndex._4_4_ != JL_STATUS_SUCCESS) && (pErrorAtPos != (size_t *)0x0)) &&
       (*pErrorAtPos == 0)) {
      *pErrorAtPos = params._40_8_;
    }
  }
  return prevStringIndex._4_4_;
}

Assistant:

JL_STATUS
    JlParseJsonEx
    (
        char const*     JsonString,
        bool            IsJson5,
        JlDataObject**  pRootObject,
        size_t*         pErrorAtPos
    )
{
    JL_STATUS jlStatus;

    if(     NULL != JsonString
        &&  NULL != pRootObject )
    {
        size_t prevStringIndex = 0;
        ParseParameters params = { 0 };
        params.JsonString = JsonString;
        params.JsonStringLength = strlen( JsonString );
        params.StringIndex = 0;
        params.IsJson5 = IsJson5;
        // Stack is allocated 2 more because we don't use the first element and we need an extra one to contain the last list
        // or dictionary nest levels items.
        params.Stack = JlAlloc( sizeof(ParseStack) * (MAX_JSON_DEPTH+2) );

        if( NULL != pErrorAtPos )
        {
            *pErrorAtPos = 0;
        }

        if( NULL != params.Stack )
        {
            // Setup first item in stack as the "none" type (for whitespace). When this is popped off we
            // will have finished.
            params.StackIndex = 0;
            params.Stack[0].Type = JL_DATA_TYPE_NONE;
            params.Stack[0].ScanForSubObjects = true;

            jlStatus = JL_STATUS_SUCCESS;
            while( params.StackIndex >= 0  &&  JL_STATUS_SUCCESS == jlStatus )
            {
                ParseStack* stackItem = &params.Stack[params.StackIndex];

                if( ! stackItem->FinishedProcessing )
                {
                    prevStringIndex = params.StringIndex;
                    if( params.Stack[params.StackIndex].ScanForSubObjects )
                    {
                        if( JL_DATA_TYPE_NONE == params.Stack[params.StackIndex].Type )
                        {
                            // Note we must mark it finished first because ParseForNewType will adjust StackIndex
                            stackItem->FinishedProcessing = true;
                            stackItem->ScanForSubObjects = false;
                        }
                        // Turn off scanning for sub objects as we will need to go back to list or dictionary
                        // processing between objects
                        stackItem->ScanForSubObjects = false;

                        jlStatus = ParseForNewType( &params, IsJson5, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_STRING == stackItem->Type )
                    {
                        jlStatus = ParseForString( &params, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_NUMBER == stackItem->Type )
                    {
                        jlStatus = ParseForNumber( &params );
                    }
                    else if( JL_DATA_TYPE_BOOL == stackItem->Type )
                    {
                        jlStatus = ParseForBool( &params );
                    }
                    else if( JL_DATA_TYPE_LIST == stackItem->Type )
                    {
                        jlStatus = ParseForList( &params, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_DICTIONARY == stackItem->Type )
                    {
                        jlStatus = ParseForDictionary( &params, pErrorAtPos );
                    }

                }
                else
                {
                    // Attempt to attach this object to previous level (if its a list or dictionary)
                    jlStatus = AttachStackObjectToPreviousObject( params.Stack, params.StackIndex, pErrorAtPos );
                    // Finished with this level. So pop off the stack
                    params.StackIndex -= 1;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Verify that there is nothing but white space after the final object.
                jlStatus = VerifyOnlyTrailingWhiteSpace( JsonString + params.StringIndex, IsJson5 );
                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    // At this point we have a full object tree created, but the params are now
                    // reset. So modify index so it will remove the full tree (at index 1)
                    params.StackIndex = 1;

                    if( NULL != pErrorAtPos )
                    {
                        *pErrorAtPos = params.StringIndex;
                    }
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Get root object (in index position 1)
                *pRootObject = params.Stack[1].Object;
            }
            else
            {
                // Free object tree created so far
                for( int32_t i=params.StackIndex; i>0; i-- )
                {
                    (void) JlFreeObjectTree( &params.Stack[i].Object );
                    if( NULL != params.Stack[i].CurrentKeyName )
                    {
                        JlFree( params.Stack[i].CurrentKeyName );
                        params.Stack[i].CurrentKeyName = NULL;
                    }
                }
            }

            JlFree( params.Stack );
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // If optional parameter was provided, then set the position of the error in the string.
            if(     NULL != pErrorAtPos
                &&  0 == *pErrorAtPos )
            {
                *pErrorAtPos = prevStringIndex;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}